

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PP_graph.h
# Opt level: O2

void __thiscall PP_point::PP_point(PP_point *this,PP_point *other)

{
  double dVar1;
  reference __x;
  uint uVar2;
  
  this->_vptr_PP_point = (_func_int **)&PTR__PP_point_00115c20;
  (this->e).super__Vector_base<PP_edge,_std::allocator<PP_edge>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->e).super__Vector_base<PP_edge,_std::allocator<PP_edge>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->e).super__Vector_base<PP_edge,_std::allocator<PP_edge>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  dVar1 = other->y;
  this->x = other->x;
  this->y = dVar1;
  this->z = other->z;
  std::vector<PP_edge,_std::allocator<PP_edge>_>::clear(&this->e);
  for (uVar2 = 0;
      (ulong)uVar2 <
      (ulong)(((long)(other->e).super__Vector_base<PP_edge,_std::allocator<PP_edge>_>._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)(other->e).super__Vector_base<PP_edge,_std::allocator<PP_edge>_>._M_impl.
                    super__Vector_impl_data._M_start) / 0x90); uVar2 = uVar2 + 1) {
    __x = std::vector<PP_edge,_std::allocator<PP_edge>_>::at(&other->e,(ulong)uVar2);
    std::vector<PP_edge,_std::allocator<PP_edge>_>::push_back(&this->e,__x);
  }
  this->canBePartOfGraph = other->canBePartOfGraph;
  return;
}

Assistant:

PP_point( PP_point& other )
    {
        this->x = other.x;
        this->y = other.y;
        this->z = other.z;
        this->e.clear();
        for(unsigned int i=0 ; i<other.e.size() ; i++)
            this->e.push_back(other.e.at(i));
        this->canBePartOfGraph = other.canBePartOfGraph;
    }